

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_readresp(Curl_easy *data,int sockindex,pingpong *pp,int *code,size_t *size)

{
  connectdata *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  uint *puVar5;
  char *ptr;
  void *pvVar6;
  ulong size_00;
  size_t length;
  char *nl;
  char *line;
  size_t full;
  char buffer [900];
  ssize_t gotbytes;
  CURLcode result;
  connectdata *conn;
  size_t *size_local;
  int *code_local;
  pingpong *pp_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  *code = 0;
  *size = 0;
  do {
    stack0xffffffffffffffb0 = 0;
    if (pp->nfinal != 0) {
      sVar4 = Curl_dyn_len(&pp->recvbuf);
      Curl_dyn_tail(&pp->recvbuf,sVar4 - pp->nfinal);
      pp->nfinal = 0;
    }
    if (pp->overflow == 0) {
      CVar3 = pingpong_read(data,sockindex,(char *)&full,900,(ssize_t *)(buffer + 0x380));
      if (CVar3 == CURLE_AGAIN) {
        return CURLE_OK;
      }
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if ((long)stack0xffffffffffffffb0 < 1) {
        puVar5 = (uint *)__errno_location();
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar5);
        return CURLE_RECV_ERROR;
      }
      CVar3 = Curl_dyn_addn(&pp->recvbuf,&full,stack0xffffffffffffffb0);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      (data->req).headerbytecount = (int)stack0xffffffffffffffb0 + (data->req).headerbytecount;
      pp->nread_resp = stack0xffffffffffffffb0 + pp->nread_resp;
    }
    while( true ) {
      ptr = Curl_dyn_ptr(&pp->recvbuf);
      sVar4 = Curl_dyn_len(&pp->recvbuf);
      pvVar6 = memchr(ptr,10,sVar4);
      if (pvVar6 == (void *)0x0) break;
      size_00 = (long)pvVar6 + (1 - (long)ptr);
      Curl_debug(data,CURLINFO_HEADER_IN,ptr,size_00);
      CVar3 = Curl_client_write(data,2,ptr,size_00);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      _Var2 = (*pp->endofresp)(data,pcVar1,ptr,size_00,code);
      if (_Var2) {
        pp->nfinal = size_00;
        sVar4 = Curl_dyn_len(&pp->recvbuf);
        if (size_00 < sVar4) {
          sVar4 = Curl_dyn_len(&pp->recvbuf);
          pp->overflow = sVar4 - size_00;
        }
        else {
          pp->overflow = 0;
        }
        *size = pp->nread_resp;
        pp->nread_resp = 0;
        stack0xffffffffffffffb0 = 0;
        goto LAB_001715f1;
      }
      sVar4 = Curl_dyn_len(&pp->recvbuf);
      if (size_00 < sVar4) {
        sVar4 = Curl_dyn_len(&pp->recvbuf);
        Curl_dyn_tail(&pp->recvbuf,sVar4 - size_00);
      }
      else {
        Curl_dyn_reset(&pp->recvbuf);
      }
    }
    pp->overflow = 0;
LAB_001715f1:
    if (stack0xffffffffffffffb0 != 900) {
      pp->pending_resp = false;
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          int sockindex,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  ssize_t gotbytes;
  char buffer[900];

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  do {
    gotbytes = 0;
    if(pp->nfinal) {
      /* a previous call left this many bytes in the beginning of the buffer as
         that was the final line; now ditch that */
      size_t full = Curl_dyn_len(&pp->recvbuf);

      /* trim off the "final" leading part */
      Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

      pp->nfinal = 0; /* now gone */
    }
    if(!pp->overflow) {
      result = pingpong_read(data, sockindex, buffer, sizeof(buffer),
                             &gotbytes);
      if(result == CURLE_AGAIN)
        return CURLE_OK;

      if(result)
        return result;

      if(gotbytes <= 0) {
        failf(data, "response reading failed (errno: %d)", SOCKERRNO);
        return CURLE_RECV_ERROR;
      }

      result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
      if(result)
        return result;

      data->req.headerbytecount += (unsigned int)gotbytes;

      pp->nread_resp += gotbytes;
    }

    do {
      char *line = Curl_dyn_ptr(&pp->recvbuf);
      char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
      if(nl) {
        /* a newline is CRLF in pp-talk, so the CR is ignored as
           the line is not really terminated until the LF comes */
        size_t length = nl - line + 1;

        /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
        if(!conn->sec_complete)
#endif
          Curl_debug(data, CURLINFO_HEADER_IN, line, length);

        /*
         * Pass all response-lines to the callback function registered for
         * "headers". The response lines can be seen as a kind of headers.
         */
        result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
        if(result)
          return result;

        if(pp->endofresp(data, conn, line, length, code)) {
          /* When at "end of response", keep the endofresp line first in the
             buffer since it will be accessed outside (by pingpong
             parsers). Store the overflow counter to inform about additional
             data in this buffer after the endofresp line. */
          pp->nfinal = length;
          if(Curl_dyn_len(&pp->recvbuf) > length)
            pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
          else
            pp->overflow = 0;
          *size = pp->nread_resp; /* size of the response */
          pp->nread_resp = 0; /* restart */
          gotbytes = 0; /* force break out of outer loop */
          break;
        }
        if(Curl_dyn_len(&pp->recvbuf) > length)
          /* keep the remaining piece */
          Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
        else
          Curl_dyn_reset(&pp->recvbuf);
      }
      else {
        /* without a newline, there is no overflow */
        pp->overflow = 0;
        break;
      }

    } while(1); /* while there is buffer left to scan */

  } while(gotbytes == sizeof(buffer));

  pp->pending_resp = FALSE;

  return result;
}